

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'"'>,_toml::detail::exactly<3UL>_>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  undefined1 local_68 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  location *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'"'>,_toml::detail::exactly<3UL>_>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_68,loc);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_ok
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  if (bVar1) {
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(result<toml::detail::region,_toml::detail::none_t> *)local_68
              );
  }
  else {
    either<toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
    ::invoke(__return_storage_ptr__,(location *)rslt.field_1.succ.value.last_._M_current);
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }